

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
::dealloc(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
          *this)

{
  size_t sVar1;
  slot_type *m;
  allocator_type *alloc;
  CommonFields *pCVar2;
  void *p;
  HashtablezInfoHandle local_11;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  *local_10;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  *this_local;
  
  local_10 = this;
  sVar1 = capacity(this);
  if (sVar1 == 0) {
    __assert_fail("(capacity() != 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe4f,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>, absl::hash_internal::Hash<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, std::equal_to<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, std::allocator<std::pair<const google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>>>::dealloc() [Policy = absl::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>, Hash = absl::hash_internal::Hash<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, Eq = std::equal_to<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, Alloc = std::allocator<std::pair<const google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>>]"
                 );
  }
  m = slot_array(this);
  sVar1 = capacity(this);
  SanitizerUnpoisonMemoryRegion(m,sVar1 * 0x30);
  infoz(this);
  HashtablezInfoHandle::Unregister(&local_11);
  alloc = alloc_ref(this);
  pCVar2 = common(this);
  p = CommonFields::backing_array_start(pCVar2);
  pCVar2 = common(this);
  sVar1 = CommonFields::alloc_size(pCVar2,0x30,8);
  Deallocate<8ul,std::allocator<std::pair<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey_const,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>>>
            (alloc,p,sVar1);
  return;
}

Assistant:

inline void dealloc() {
    ABSL_SWISSTABLE_ASSERT(capacity() != 0);
    // Unpoison before returning the memory to the allocator.
    SanitizerUnpoisonMemoryRegion(slot_array(), sizeof(slot_type) * capacity());
    infoz().Unregister();
    Deallocate<BackingArrayAlignment(alignof(slot_type))>(
        &alloc_ref(), common().backing_array_start(),
        common().alloc_size(sizeof(slot_type), alignof(slot_type)));
  }